

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O0

void api_suite::api_ctor_copy_assign(void)

{
  undefined4 local_7c;
  size_type local_78;
  undefined4 local_6c;
  size_type local_68 [2];
  undefined1 local_58 [8];
  circular_array<int,_4UL> copy;
  circular_array<int,_4UL> data;
  
  vista::circular_array<int,_4UL>::circular_array
            ((circular_array<int,_4UL> *)&copy.super_circular_view<int,_4UL>.member.next);
  vista::circular_view<int,_4UL>::push_back
            ((circular_view<int,_4UL> *)(data.super_array<int,_4UL>._M_elems + 2),0xb);
  vista::circular_array<int,_4UL>::circular_array((circular_array<int,_4UL> *)local_58);
  vista::circular_array<int,_4UL>::operator=
            ((circular_array<int,_4UL> *)local_58,
             (circular_array<int,_4UL> *)&copy.super_circular_view<int,_4UL>.member.next);
  local_68[0] = vista::circular_view<int,_4UL>::size
                          ((circular_view<int,_4UL> *)(copy.super_array<int,_4UL>._M_elems + 2));
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x2d,"void api_suite::api_ctor_copy_assign()",local_68,&local_6c);
  local_78 = vista::circular_view<int,_4UL>::capacity
                       ((circular_view<int,_4UL> *)(copy.super_array<int,_4UL>._M_elems + 2));
  local_7c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x2e,"void api_suite::api_ctor_copy_assign()",&local_78,&local_7c);
  return;
}

Assistant:

void api_ctor_copy_assign()
{
    circular_array<int, 4> data;
    data.push_back(11);
    circular_array<int, 4> copy;
    copy = data;
    BOOST_TEST_EQ(copy.size(), 1);
    BOOST_TEST_EQ(copy.capacity(), 4);
}